

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointlight.hpp
# Opt level: O1

Color __thiscall
PointLight::sampleIrradiance
          (PointLight *this,point *surface,vec3f *dirToLight,float *dist,Sampler *param_4)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  Color CVar13;
  
  fVar10 = (this->position).x - surface->x;
  fVar11 = (this->position).y - surface->y;
  fVar7 = (this->position).z - surface->z;
  fVar7 = fVar7 * fVar7 + fVar10 * fVar10 + fVar11 * fVar11;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  *dist = fVar7;
  fVar10 = (this->position).z - surface->z;
  uVar1 = (this->position).x;
  uVar4 = (this->position).y;
  uVar2 = surface->x;
  uVar5 = surface->y;
  fVar11 = (float)uVar1 - (float)uVar2;
  fVar12 = (float)uVar4 - (float)uVar5;
  fVar7 = fVar10 * fVar10 + fVar11 * fVar11 + fVar12 * fVar12;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = 1.0 / fVar7;
  dirToLight->x = fVar11 * fVar7;
  dirToLight->y = fVar12 * fVar7;
  dirToLight->z = fVar10 * fVar7;
  fVar7 = (this->position).x - surface->x;
  fVar10 = (this->position).y - surface->y;
  fVar11 = (this->position).z - surface->z;
  fVar7 = fVar11 * fVar11 + fVar7 * fVar7 + fVar10 * fVar10;
  uVar3 = (this->intensity).x;
  uVar6 = (this->intensity).y;
  auVar8._4_4_ = uVar6;
  auVar8._0_4_ = uVar3;
  auVar8._8_8_ = 0;
  CVar13.z = (this->intensity).z / fVar7;
  auVar9._4_4_ = fVar7;
  auVar9._0_4_ = fVar7;
  auVar9._8_4_ = fVar7;
  auVar9._12_4_ = fVar7;
  auVar9 = divps(auVar8,auVar9);
  CVar13._0_8_ = auVar9._0_8_;
  return CVar13;
}

Assistant:

Color sampleIrradiance(const point& surface, vec3f& dirToLight, float& dist, Sampler&) const
	{
		dist = norm(position - surface);
		dirToLight = normalized(position - surface);
		return intensity / sqrlen(position - surface);
	}